

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

string * __thiscall
llvm::sys::path::convert_to_slash_abi_cxx11_
          (string *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char local_22 [2];
  StringRef local_20;
  
  local_20.Length = (size_t)path.Data;
  local_20.Data = (char *)this;
  StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_20);
  if ((int)path.Length == 0) {
    __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_22[1] = 0x5c;
    local_22[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + __return_storage_ptr__->_M_string_length),
               local_22 + 1,local_22);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_slash(StringRef path, Style style) {
  if (real_style(style) != Style::windows)
    return path;

  std::string s = path.str();
  std::replace(s.begin(), s.end(), '\\', '/');
  return s;
}